

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

void update_motion_stat(AV1_COMP *cpi)

{
  int local_4c;
  RATE_CONTROL *lrc;
  LAYER_CONTEXT *lc;
  int layer;
  int i;
  int avg_cnt_zeromv;
  SVC *svc;
  RATE_CONTROL *rc;
  CommonModeInfoParams *mi_params;
  AV1_COMMON *cm;
  AV1_COMP *cpi_local;
  
  local_4c = ((cpi->rc).cnt_zeromv * 100) /
             ((cpi->common).mi_params.mi_rows * (cpi->common).mi_params.mi_cols);
  if ((cpi->ppi->use_svc == 0) ||
     (((cpi->ppi->use_svc != 0 &&
       ((cpi->svc).layer_context[(cpi->svc).temporal_layer_id].is_key_frame == 0)) &&
      ((cpi->svc).spatial_layer_id == (cpi->svc).number_spatial_layers + -1)))) {
    if ((cpi->rc).avg_frame_low_motion != 0) {
      local_4c = ((cpi->rc).avg_frame_low_motion * 3 + local_4c) / 4;
    }
    (cpi->rc).avg_frame_low_motion = local_4c;
    if ((cpi->ppi->use_svc != 0) &&
       ((cpi->svc).spatial_layer_id == (cpi->svc).number_spatial_layers + -1)) {
      for (i = 0; i < (cpi->svc).number_spatial_layers + -1; i = i + 1) {
        (cpi->svc).layer_context
        [i * (cpi->svc).number_temporal_layers + (cpi->svc).temporal_layer_id].rc.
        avg_frame_low_motion = (cpi->rc).avg_frame_low_motion;
      }
    }
  }
  return;
}

Assistant:

static void update_motion_stat(AV1_COMP *const cpi) {
  AV1_COMMON *const cm = &cpi->common;
  const CommonModeInfoParams *const mi_params = &cm->mi_params;
  RATE_CONTROL *const rc = &cpi->rc;
  SVC *const svc = &cpi->svc;
  const int avg_cnt_zeromv =
      100 * cpi->rc.cnt_zeromv / (mi_params->mi_rows * mi_params->mi_cols);
  if (!cpi->ppi->use_svc ||
      (cpi->ppi->use_svc &&
       !cpi->svc.layer_context[cpi->svc.temporal_layer_id].is_key_frame &&
       cpi->svc.spatial_layer_id == cpi->svc.number_spatial_layers - 1)) {
    rc->avg_frame_low_motion =
        (rc->avg_frame_low_motion == 0)
            ? avg_cnt_zeromv
            : (3 * rc->avg_frame_low_motion + avg_cnt_zeromv) / 4;
    // For SVC: set avg_frame_low_motion (only computed on top spatial layer)
    // to all lower spatial layers.
    if (cpi->ppi->use_svc &&
        svc->spatial_layer_id == svc->number_spatial_layers - 1) {
      for (int i = 0; i < svc->number_spatial_layers - 1; ++i) {
        const int layer = LAYER_IDS_TO_IDX(i, svc->temporal_layer_id,
                                           svc->number_temporal_layers);
        LAYER_CONTEXT *const lc = &svc->layer_context[layer];
        RATE_CONTROL *const lrc = &lc->rc;
        lrc->avg_frame_low_motion = rc->avg_frame_low_motion;
      }
    }
  }
}